

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

Mode __thiscall adios2::Engine::OpenMode(Engine *this)

{
  Engine *pointer;
  Mode MVar1;
  allocator local_39;
  string local_38;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_38,"in call to Engine::OpenMode",&local_39);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  MVar1 = adios2::core::Engine::OpenMode();
  return MVar1;
}

Assistant:

Mode Engine::OpenMode() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::OpenMode");
    return m_Engine->OpenMode();
}